

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getNextString_63(UResourceBundle *resB,int32_t *len,char **key,UErrorCode *status)

{
  UBool UVar1;
  Resource RVar2;
  Resource r;
  UErrorCode *status_local;
  char **key_local;
  int32_t *len_local;
  UResourceBundle *resB_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)0x0;
  }
  else if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    resB_local = (UResourceBundle *)0x0;
  }
  else if (resB->fIndex == resB->fSize + -1) {
    *status = U_INDEX_OUTOFBOUNDS_ERROR;
    resB_local = (UResourceBundle *)0x0;
  }
  else {
    resB->fIndex = resB->fIndex + 1;
    switch(resB->fRes >> 0x1c) {
    case 0:
    case 6:
      resB_local = (UResourceBundle *)res_getString_63(&resB->fResData,resB->fRes,len);
      break;
    case 1:
    case 7:
    case 0xe:
      *status = U_RESOURCE_TYPE_MISMATCH;
    default:
      resB_local = (UResourceBundle *)0x0;
      break;
    case 2:
    case 4:
    case 5:
      RVar2 = res_getTableItemByIndex_63(&resB->fResData,resB->fRes,resB->fIndex,key);
      resB_local = (UResourceBundle *)ures_getStringWithAlias(resB,RVar2,resB->fIndex,len,status);
      break;
    case 3:
      resB_local = (UResourceBundle *)
                   ures_getStringWithAlias(resB,resB->fRes,resB->fIndex,len,status);
      break;
    case 8:
    case 9:
      RVar2 = res_getArrayItem_63(&resB->fResData,resB->fRes,resB->fIndex);
      resB_local = (UResourceBundle *)ures_getStringWithAlias(resB,RVar2,resB->fIndex,len,status);
    }
  }
  return (UChar *)resB_local;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getNextString(UResourceBundle *resB, int32_t* len, const char ** key, UErrorCode *status) {
  Resource r = RES_BOGUS;
  
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  
  if(resB->fIndex == resB->fSize-1) {
    *status = U_INDEX_OUTOFBOUNDS_ERROR;
  } else {
    resB->fIndex++;
    switch(RES_GET_TYPE(resB->fRes)) {
    case URES_STRING:
    case URES_STRING_V2:
      return res_getString(&(resB->fResData), resB->fRes, len); 
    case URES_TABLE:
    case URES_TABLE16:
    case URES_TABLE32:
      r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, resB->fIndex, key);
      if(r == RES_BOGUS && resB->fHasFallback) {
        /* TODO: do the fallback */
      }
      return ures_getStringWithAlias(resB, r, resB->fIndex, len, status);
    case URES_ARRAY:
    case URES_ARRAY16:
      r = res_getArrayItem(&(resB->fResData), resB->fRes, resB->fIndex);
      if(r == RES_BOGUS && resB->fHasFallback) {
        /* TODO: do the fallback */
      }
      return ures_getStringWithAlias(resB, r, resB->fIndex, len, status);
    case URES_ALIAS:
      return ures_getStringWithAlias(resB, resB->fRes, resB->fIndex, len, status);
    case URES_INT:
    case URES_BINARY:
    case URES_INT_VECTOR:
        *status = U_RESOURCE_TYPE_MISMATCH;
        U_FALLTHROUGH;
    default:
      return NULL;
    }
  }

  return NULL;
}